

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall
c4::basic_substring<char>::last_of(basic_substring<char> *this,char c,size_t start)

{
  long lVar1;
  ulong in_RAX;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = this->len;
  if (this->len < start && start != 0xffffffffffffffff) {
    last_of();
    uVar3 = in_RAX;
  }
  if (start != 0xffffffffffffffff) {
    uVar3 = start;
  }
  do {
    uVar2 = uVar3 - 1;
    if (uVar3 == 0) {
      return 0xffffffffffffffff;
    }
    lVar1 = uVar3 - 1;
    uVar3 = uVar2;
  } while (this->str[lVar1] != c);
  return uVar2;
}

Assistant:

size_t last_of(const C c, size_t start=npos) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        if(start == npos)
            start = len;
        for(size_t i = start-1; i != size_t(-1); --i)
        {
            if(str[i] == c)
                return i;
        }
        return npos;
    }